

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemWatcher.cpp
# Opt level: O2

void __thiscall FileSystemWatcher::processChanges(FileSystemWatcher *this,uint types)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  long lVar3;
  lock_guard<std::mutex> lock;
  Set<Path> p;
  anon_struct_24_3_203d5c27 signals [3];
  
  if (types != 0) {
    signals[0].type = Add;
    signals[0].signal = &this->mAdded;
    signals[0].paths = &this->mAddedPaths;
    signals[1].type = Remove;
    signals[1].signal = &this->mRemoved;
    signals[1].paths = &this->mRemovedPaths;
    signals[2].type = Modified;
    signals[2].signal = &this->mModified;
    signals[2].paths = &this->mModifiedPaths;
    p_Var1 = &p.super_set<Path,_std::less<Path>,_std::allocator<Path>_>._M_t._M_impl.
              super__Rb_tree_header;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      if ((signals[lVar3].type & types) != 0) {
        p.super_set<Path,_std::less<Path>,_std::allocator<Path>_>._M_t._M_impl.super__Rb_tree_header
        ._M_header._M_color = _S_red;
        p.super_set<Path,_std::less<Path>,_std::allocator<Path>_>._M_t._M_impl.super__Rb_tree_header
        ._M_header._M_parent = (_Base_ptr)0x0;
        p.super_set<Path,_std::less<Path>,_std::allocator<Path>_>._M_t._M_impl.super__Rb_tree_header
        ._M_node_count = 0;
        p.super_set<Path,_std::less<Path>,_std::allocator<Path>_>._M_t._M_impl.super__Rb_tree_header
        ._M_header._M_left = &p_Var1->_M_header;
        p.super_set<Path,_std::less<Path>,_std::allocator<Path>_>._M_t._M_impl.super__Rb_tree_header
        ._M_header._M_right = &p_Var1->_M_header;
        std::mutex::lock(&this->mMutex);
        std::swap<Set<Path>>(&p,signals[lVar3].paths);
        pthread_mutex_unlock((pthread_mutex_t *)&this->mMutex);
        for (p_Var2 = p.super_set<Path,_std::less<Path>,_std::allocator<Path>_>._M_t._M_impl.
                      super__Rb_tree_header._M_header._M_left; (_Rb_tree_header *)p_Var2 != p_Var1;
            p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
          Signal<std::function<void(Path_const&)>>::operator()
                    ((Signal<std::function<void(Path_const&)>> *)signals[lVar3].signal,
                     (Path *)(p_Var2 + 1));
        }
        std::_Rb_tree<Path,_Path,_std::_Identity<Path>,_std::less<Path>,_std::allocator<Path>_>::
        ~_Rb_tree((_Rb_tree<Path,_Path,_std::_Identity<Path>,_std::less<Path>,_std::allocator<Path>_>
                   *)&p);
      }
    }
    return;
  }
  __assert_fail("types",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/FileSystemWatcher.cpp"
                ,0x22,"void FileSystemWatcher::processChanges(unsigned int)");
}

Assistant:

void FileSystemWatcher::processChanges(unsigned int types)
{
    assert(types);
    struct {
        const Type type;
        Signal<std::function<void(const Path&)> > &signal;
        Set<Path> &paths;
    } signals[] = {
        { Add, mAdded, mAddedPaths },
        { Remove, mRemoved, mRemovedPaths },
        { Modified, mModified, mModifiedPaths }
    };

    const unsigned int count = sizeof(signals) / sizeof(signals[0]);
    for (unsigned i=0; i<count; ++i) {
        if (types & signals[i].type) {
            Set<Path> p;
            {
                std::lock_guard<std::mutex> lock(mMutex);
                std::swap(p, signals[i].paths);
            }

            for (Set<Path>::const_iterator it = p.begin(); it != p.end(); ++it) {
                signals[i].signal(*it);
            }
        }
    }
}